

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

uint __thiscall capnp::Type::hashCode(Type *this)

{
  byte bVar1;
  Which WVar2;
  uint uVar3;
  size_t sVar4;
  ArrayPtr<const_unsigned_char> s;
  uint local_c;
  uint local_8;
  int local_4;
  
  WVar2 = this->baseType;
  if (WVar2 < LIST) {
    local_c = (uint)WVar2;
  }
  else {
    if (2 < WVar2 - 0xf) {
      if (WVar2 != ANY_POINTER) {
        kj::_::unreachable();
      }
      local_c = (uint)(this->field_3).paramIndex;
      bVar1 = this->isImplicitParam;
      local_4 = (int)((this->field_4).scopeId >> 0x20) * 0xbfe3 + (int)(this->field_4).scopeId;
      sVar4 = 0xc;
      goto LAB_002124f0;
    }
    local_c = (int)((this->field_4).scopeId >> 0x20) * 0xbfe3 + (int)(this->field_4).scopeId;
  }
  bVar1 = this->listDepth;
  sVar4 = 8;
LAB_002124f0:
  local_8 = (uint)bVar1;
  s.ptr = &local_c;
  s.size_ = sVar4;
  uVar3 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s);
  return uVar3;
}

Assistant:

uint Type::hashCode() const {
  switch (baseType) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
      return kj::hashCode(baseType, listDepth);

    case schema::Type::STRUCT:
    case schema::Type::ENUM:
    case schema::Type::INTERFACE:
      return kj::hashCode(schema, listDepth);

    case schema::Type::LIST:
      KJ_UNREACHABLE;

    case schema::Type::ANY_POINTER: {
      // Trying to comply with strict aliasing rules. Hopefully the compiler realizes that
      // both branches compile to the same instructions and can optimize it away.
      uint16_t val = scopeId != 0 || isImplicitParam ?
          paramIndex : static_cast<uint16_t>(anyPointerKind);
      return kj::hashCode(val, isImplicitParam, scopeId);
    }
  }

  KJ_UNREACHABLE;
}